

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render_tree.cpp
# Opt level: O1

idx_t duckdb::CreateTreeRecursive<duckdb::PipelineRenderNode>
                (RenderTree *result,PipelineRenderNode *op,idx_t x,idx_t y)

{
  idx_t iVar1;
  pointer *__ptr;
  unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>,_true> node;
  idx_t width;
  _Head_base<0UL,_duckdb::RenderTreeNode_*,_false> local_68;
  _Head_base<0UL,_duckdb::RenderTreeNode_*,_false> local_60;
  _Head_base<0UL,_duckdb::RenderTreeNode_*,_false> local_58;
  idx_t local_50;
  idx_t local_48;
  idx_t local_40;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  local_50 = y;
  local_48 = x;
  CreateNode((duckdb *)&local_68,op->op);
  if ((op->child).
      super_unique_ptr<duckdb::PipelineRenderNode,_std::default_delete<duckdb::PipelineRenderNode>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::PipelineRenderNode,_std::default_delete<duckdb::PipelineRenderNode>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::PipelineRenderNode_*,_std::default_delete<duckdb::PipelineRenderNode>_>
      .super__Head_base<0UL,_duckdb::PipelineRenderNode_*,_false>._M_head_impl ==
      (PipelineRenderNode *)0x0) {
    local_58._M_head_impl = local_68._M_head_impl;
    local_68._M_head_impl = (RenderTreeNode *)0x0;
    RenderTree::SetNode(result,local_48,local_50,
                        (unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>,_true>
                         *)&local_58);
    if (local_58._M_head_impl != (RenderTreeNode *)0x0) {
      std::default_delete<duckdb::RenderTreeNode>::operator()
                ((default_delete<duckdb::RenderTreeNode> *)&local_58,local_58._M_head_impl);
    }
    local_58._M_head_impl = (RenderTreeNode *)0x0;
    iVar1 = 1;
  }
  else {
    local_40 = 0;
    local_28 = (code *)0x0;
    pcStack_20 = (code *)0x0;
    local_38._M_unused._M_object = (void *)0x0;
    local_38._8_8_ = 0;
    local_38._M_unused._M_object = operator_new(0x28);
    *(idx_t **)local_38._M_unused._0_8_ = &local_48;
    *(idx_t **)((long)local_38._M_unused._0_8_ + 8) = &local_40;
    *(idx_t **)((long)local_38._M_unused._0_8_ + 0x10) = &local_50;
    *(_Head_base<0UL,_duckdb::RenderTreeNode_*,_false> **)((long)local_38._M_unused._0_8_ + 0x18) =
         &local_68;
    *(RenderTree **)((long)local_38._M_unused._0_8_ + 0x20) = result;
    pcStack_20 = std::
                 _Function_handler<void_(const_duckdb::PipelineRenderNode_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/common/render_tree.cpp:137:39)>
                 ::_M_invoke;
    local_28 = std::
               _Function_handler<void_(const_duckdb::PipelineRenderNode_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/common/render_tree.cpp:137:39)>
               ::_M_manager;
    anon_unknown.dwarf_a14ff2::TreeChildrenIterator::Iterate<duckdb::PipelineRenderNode>
              (op,(function<void_(const_duckdb::PipelineRenderNode_&)> *)&local_38);
    if (local_28 != (code *)0x0) {
      (*local_28)((_Any_data *)&local_38,(_Any_data *)&local_38,__destroy_functor);
    }
    local_60._M_head_impl = local_68._M_head_impl;
    local_68._M_head_impl = (RenderTreeNode *)0x0;
    RenderTree::SetNode(result,local_48,local_50,
                        (unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>,_true>
                         *)&local_60);
    if (local_60._M_head_impl != (RenderTreeNode *)0x0) {
      std::default_delete<duckdb::RenderTreeNode>::operator()
                ((default_delete<duckdb::RenderTreeNode> *)&local_60,local_60._M_head_impl);
    }
    local_60._M_head_impl = (RenderTreeNode *)0x0;
    iVar1 = local_40;
  }
  if (local_68._M_head_impl != (RenderTreeNode *)0x0) {
    std::default_delete<duckdb::RenderTreeNode>::operator()
              ((default_delete<duckdb::RenderTreeNode> *)&local_68,local_68._M_head_impl);
  }
  return iVar1;
}

Assistant:

static idx_t CreateTreeRecursive(RenderTree &result, const T &op, idx_t x, idx_t y) {
	auto node = CreateNode(op);

	if (!TreeChildrenIterator::HasChildren(op)) {
		result.SetNode(x, y, std::move(node));
		return 1;
	}
	idx_t width = 0;
	// render the children of this node
	TreeChildrenIterator::Iterate<T>(op, [&](const T &child) {
		auto child_x = x + width;
		auto child_y = y + 1;
		node->AddChildPosition(child_x, child_y);
		width += CreateTreeRecursive<T>(result, child, child_x, child_y);
	});
	result.SetNode(x, y, std::move(node));
	return width;
}